

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_t attempts;
  char *pcVar1;
  typed_value<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_char> *ptVar2;
  typed_value<unsigned_long,_char> *this;
  const_iterator cVar3;
  long *plVar4;
  any *paVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  unsigned_long *puVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> arities;
  options_description description;
  variables_map vm;
  undefined1 local_1a8 [16];
  undefined1 local_198 [40];
  pointer local_170;
  pointer local_168 [2];
  undefined1 local_158 [48];
  void *local_128;
  undefined4 local_120;
  undefined8 local_118;
  undefined4 local_110;
  long local_108;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_100 [24];
  long *local_e8 [2];
  long local_d8;
  _Rb_tree_node_base local_d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  
  local_e8[0] = &local_d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e8,anon_var_dwarf_11c08,anon_var_dwarf_11c08 + 10);
  boost::program_options::options_description::options_description
            ((options_description *)local_168,(string *)local_e8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if (local_e8[0] != &local_d8) {
    operator_delete(local_e8[0],local_d8 + 1);
  }
  local_e8[0] = (long *)boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_e8,"help,h");
  ptVar2 = boost::program_options::value<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0);
  ptVar2->m_multitoken = true;
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"arity",(char *)ptVar2);
  this = boost::program_options::value<unsigned_long>((unsigned_long *)0x0);
  local_1a8._0_8_ = (pointer)0x3e8;
  boost::program_options::typed_value<unsigned_long,_char>::default_value
            (this,(unsigned_long *)local_1a8);
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"attempts");
  boost::program_options::variables_map::variables_map((variables_map *)local_e8);
  local_48.super_function_base.vtable = (vtable_base *)0x0;
  local_48.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_48.super_function_base.functor._8_8_ = 0;
  local_48.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_1a8,argc,argv,(options_description *)local_168,0,
             &local_48);
  boost::program_options::store((basic_parsed_options *)local_1a8,(variables_map *)local_e8,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_1a8);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_48);
  boost::program_options::notify((variables_map *)local_e8);
  local_1a8._0_8_ = (pointer)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"help","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)&local_d8,(key_type *)local_1a8);
  if ((pointer)local_1a8._0_8_ != (pointer)local_198) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
  }
  if (cVar3._M_node == &local_d0) {
    local_1a8._0_8_ = (pointer)local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"arity","");
    paVar5 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_e8);
    __x = boost::any_cast<std::vector<unsigned_long,std::allocator<unsigned_long>>const&>(paVar5);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_198 + 0x18),__x);
    if ((pointer)local_1a8._0_8_ != (pointer)local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
    }
    local_1a8._0_8_ = (pointer)local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"attempts","");
    paVar5 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_e8);
    puVar6 = boost::any_cast<unsigned_long_const&>(paVar5);
    attempts = *puVar6;
    if ((pointer)local_1a8._0_8_ != (pointer)local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
    }
    test<std::vector<unsigned_long,std::allocator<unsigned_long>>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_198 + 0x18),attempts)
    ;
    if ((void *)local_198._24_8_ != (void *)0x0) {
      operator_delete((void *)local_198._24_8_,(long)local_170 - local_198._24_8_);
    }
  }
  else {
    plVar4 = (long *)boost::program_options::operator<<
                               ((ostream *)&std::cout,(options_description *)local_168);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
  }
  local_e8[0] = (long *)&std::length_error::typeinfo;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_78);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               *)&local_d8);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_100);
  if (local_128 != (void *)0x0) {
    operator_delete(local_128,local_108 - (long)local_128);
    local_128 = (void *)0x0;
    local_120 = 0;
    local_118 = 0;
    local_110 = 0;
    local_108 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector((vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
             *)(local_158 + 0x18));
  if (local_168[0] != (pointer)local_158) {
    operator_delete(local_168[0],(ulong)(local_158._0_8_ + 1));
  }
  return 0;
}

Assistant:

int main (int argc, const char * argv[])
{
    namespace bpo = boost::program_options;

    bpo::options_description description("Опции");
    description.add_options()
        ("help,h", "Подсказка")
        ("arity", bpo::value<std::vector<std::size_t>>()->multitoken(), "Набор кратностей для испытаний")
        ("attempts", bpo::value<std::size_t>()->default_value(1000));

    try
    {
        bpo::variables_map vm;
        bpo::store(bpo::parse_command_line(argc, argv, description), vm);
        bpo::notify(vm);

        if (vm.count("help"))
        {
            std::cout << description << std::endl;
        }
        else
        {
            std::vector<std::size_t> arities = vm["arity"].as<std::vector<std::size_t>>();
            std::size_t attempts = vm["attempts"].as<std::size_t>();

            test(arities, attempts);
        }
    }
    catch (bpo::error & e)
    {
        std::cout << e.what() << std::endl;
        std::cout << description << std::endl;
    }
}